

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EcMasterlibMain.cpp
# Opt level: O1

int mainEtherCAT(int nArgc,char **ppArgv)

{
  char **ppcVar1;
  long lVar2;
  EC_T_DWORD EVar3;
  uint __seed;
  int iVar4;
  int iVar5;
  long *plVar6;
  size_t sVar7;
  void *pvTimingEvent;
  ulong uVar8;
  EC_T_LINK_PARMS *poLinkParmsRed;
  EC_T_CHAR *pEVar9;
  int iVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  ulong local_8b0;
  EC_T_CHAR tcStorage;
  EC_T_CHAR *local_898;
  char **local_890;
  char *local_888;
  EC_T_BOOL bGetNextWord;
  undefined8 local_878;
  long local_870;
  long local_868;
  long local_860;
  long local_858;
  undefined8 local_850;
  undefined8 local_848;
  EC_T_PBYTE local_840;
  EC_T_LINK_PARMS *apLinkParms [5];
  EC_T_OS_PARMS oOsParms;
  EC_T_CHAR szENIFilename [256];
  EC_T_CHAR szLogFileprefix [256];
  EC_T_CHAR szFullCommandLine [512];
  CAtEmLogging oLogging;
  EC_T_CHAR szCommandLine [512];
  
  bGetNextWord = 1;
  bVar12 = false;
  local_898 = (char *)0x0;
  tcStorage = '\0';
  memset(szLogFileprefix,0,0x100);
  memset(szENIFilename,0,0x100);
  CAtEmLogging::CAtEmLogging(&oLogging);
  apLinkParms[0] = (EC_T_LINK_PARMS *)0x0;
  apLinkParms[1] = (EC_T_LINK_PARMS *)0x0;
  apLinkParms[2] = (EC_T_LINK_PARMS *)0x0;
  apLinkParms[3] = (EC_T_LINK_PARMS *)0x0;
  apLinkParms[4] = (EC_T_LINK_PARMS *)0x0;
  oOsParms.pfSystemTimeGet = (EC_PF_SYSTIME)0x0;
  oOsParms.pfHwTimerGetInputFrequency = (EC_PF_HW_TIMER_GET_INPUT_FREQUENCY)0x0;
  oOsParms.pfHwTimerModifyInitialCount = (EC_PF_HW_TIMER_MODIFY_INITIAL_COUNT)0x0;
  szCommandLine[0] = '\0';
  oOsParms.dwValPattern = 0;
  oOsParms.dwSize = 0x28;
  oOsParms.dwSupportedFeatures = 0xffffffff;
  oOsParms.dwReserved = 0;
  EVar3 = EnableRealtimeEnvironment();
  bVar13 = true;
  iVar10 = -1;
  if (EVar3 == 0) {
    local_840 = (EC_T_PBYTE)szENIFilename;
    sigemptyset((sigset_t *)szFullCommandLine);
    sigaddset((sigset_t *)szFullCommandLine,0xe);
    bVar12 = false;
    sigprocmask(0,(sigset_t *)szFullCommandLine,(sigset_t *)0x0);
    __seed = OsQueryMsecCount();
    srand(__seed);
    bRun = 1;
    OsAddDbgMsgHook(CAtEmLogging::OsDbgMsgHookWrapper);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ECMASTERLIB: CYCLE_TIME: ",0x19);
    local_878 = 1;
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,1);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    szFullCommandLine[2] = '\0';
    szFullCommandLine[0] = '%';
    szFullCommandLine[1] = 's';
    if (1 < nArgc) {
      pEVar9 = szCommandLine;
      iVar10 = 0x200;
      do {
        local_868 = CONCAT44(local_868._4_4_,nArgc + -1);
        local_890 = ppArgv + 1;
        EcSnprintf(pEVar9,iVar10 + -1,szFullCommandLine,ppArgv[1]);
        iVar4 = strcmp(pEVar9,"-f");
        sVar7 = strlen(pEVar9);
        iVar10 = iVar10 - (int)sVar7;
        pcVar11 = pEVar9 + sVar7;
        strncpy(pcVar11," ",(long)(iVar10 + -1));
        pEVar9 = pEVar9 + sVar7 + 1;
        if ((nArgc == 2) || (iVar4 != 0)) {
          nArgc = (int)local_868;
        }
        else {
          nArgc = nArgc + -2;
          local_890 = ppArgv + 2;
          strncpy(pEVar9,"\"",(long)(iVar10 + -2));
          EcSnprintf(pcVar11 + 2,iVar10 + -3,szFullCommandLine,ppArgv[2]);
          sVar7 = strlen(pcVar11 + 2);
          iVar10 = (iVar10 + -2) - (int)sVar7;
          strncpy(pcVar11 + sVar7 + 2,"\" ",(long)(iVar10 + -1));
          pEVar9 = pcVar11 + sVar7 + 3;
        }
        iVar10 = iVar10 + -1;
        ppArgv = local_890;
      } while (1 < nArgc);
    }
    strncpy(szFullCommandLine,szCommandLine,0x1ff);
    local_898 = strtok(szCommandLine," ");
    if (local_898 == (char *)0x0) {
      pcVar11 = "";
      local_860 = 0xffff;
      iVar10 = -1;
      local_890 = (char **)0x3e8;
      local_868 = 0;
      local_8b0._0_4_ = 0;
      local_870 = 0;
      local_848 = 0;
      local_858 = 0;
      local_850 = 0;
    }
    else {
      local_890 = (char **)0x3e8;
      local_860 = 0xffff;
      local_878 = 1;
      pvTimingEvent = (void *)0x0;
      pcVar11 = "";
      local_850 = 0;
      local_858 = 0;
      local_848 = 0;
      local_870 = 0;
      local_8b0 = 0;
      local_868 = 0;
      bVar12 = false;
      iVar4 = -1;
      do {
        pEVar9 = local_898;
        iVar10 = strcasecmp(local_898,"-f");
        if (iVar10 == 0) {
          for (uVar8 = 3; pEVar9[uVar8] == ' '; uVar8 = uVar8 + 1) {
          }
          if (pEVar9[uVar8] == '\"') {
            if (3 < uVar8) {
              strtok((char *)0x0,"\"");
            }
            local_898 = strtok((char *)0x0,"\"");
          }
          else {
            local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
          }
          if ((local_898 == (char *)0x0) || (*local_898 == '-')) goto LAB_00146d06;
          pEVar9 = szENIFilename;
LAB_00146d61:
          EcSnprintf(pEVar9,0xff,"%s",local_898);
          bVar13 = true;
LAB_00146d7c:
          iVar10 = iVar4;
          iVar5 = iVar4;
          if (!bVar13) {
LAB_001472e3:
            iVar10 = iVar5;
            bVar13 = true;
            goto LAB_001472f0;
          }
        }
        else {
          iVar10 = strcasecmp(pEVar9,"-log");
          if (iVar10 == 0) {
            for (uVar8 = 4; pEVar9[uVar8] == ' '; uVar8 = uVar8 + 1) {
            }
            if (pEVar9[uVar8] == '\"') {
              if (3 < uVar8) {
                strtok((char *)0x0,"\"");
              }
              local_898 = strtok((char *)0x0,"\"");
            }
            else {
              local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
            }
            if ((local_898 != (char *)0x0) && (*local_898 != '-')) {
              pEVar9 = szLogFileprefix;
              goto LAB_00146d61;
            }
LAB_00146d06:
            iVar4 = -2;
            bVar13 = false;
            goto LAB_00146d7c;
          }
          iVar5 = strcasecmp(pEVar9,"-t");
          iVar10 = iVar4;
          if (iVar5 == 0) {
            local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
            iVar5 = -2;
            if ((local_898 == (EC_T_CHAR *)0x0) || (*local_898 == '-')) goto LAB_001472e3;
            local_868 = strtol(local_898,(char **)0x0,0);
          }
          else {
            iVar5 = strcasecmp(pEVar9,"-auxclk");
            if (iVar5 == 0) {
              local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
              iVar10 = -2;
              if ((local_898 != (EC_T_CHAR *)0x0) && (*local_898 != '-')) {
                uVar8 = strtol(local_898,(char **)0x0,0);
                local_890 = (char **)(uVar8 & 0xffffffff);
                if ((uint)uVar8 < 0xb) {
                  local_890 = (char **)0xa;
                }
                bVar12 = true;
                iVar10 = iVar4;
                goto LAB_00146d87;
              }
              bVar13 = true;
              bVar12 = true;
              goto LAB_001472f0;
            }
            iVar5 = strcasecmp(pEVar9,"-b");
            if (iVar5 == 0) {
              if (bVar12) {
                OsDbgMsg("Using bus cycle time %d usec from auxclock parameter\n");
              }
              else {
                local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
                iVar5 = -2;
                if ((local_898 == (EC_T_CHAR *)0x0) || (*local_898 == '-')) goto LAB_001472e3;
                local_890 = (char **)strtol(local_898,(char **)0x0,0);
              }
              goto LAB_00146d87;
            }
            iVar5 = strcasecmp(pEVar9,"-a");
            if (iVar5 == 0) {
              local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
              iVar5 = -2;
              if ((local_898 == (EC_T_CHAR *)0x0) || (*local_898 == '-')) goto LAB_001472e3;
              local_870 = strtol(local_898,(char **)0x0,0);
              goto LAB_00146d87;
            }
            iVar5 = strcasecmp(pEVar9,"-v");
            if (iVar5 == 0) {
              local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
              iVar5 = -2;
              if ((local_898 == (EC_T_CHAR *)0x0) || (*local_898 == '-')) goto LAB_001472e3;
              local_858 = strtol(local_898,(char **)0x0,10);
              goto LAB_00146d87;
            }
            iVar5 = strcasecmp(pEVar9,"-perf");
            if (iVar5 == 0) {
              local_848 = 1;
              goto LAB_00146d87;
            }
            iVar5 = strcasecmp(pEVar9,"-sp");
            if (iVar5 == 0) {
              local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
              if ((local_898 == (EC_T_CHAR *)0x0) || (*local_898 == '-')) {
                bGetNextWord = 0;
                local_860 = CONCAT62((int6)((ulong)local_898 >> 0x10),6000);
              }
              else {
                local_860 = strtol(local_898,(char **)0x0,10);
              }
              goto LAB_00146d87;
            }
            iVar5 = strcasecmp(pEVar9,"-dcmmode");
            if (iVar5 == 0) {
              local_888 = pcVar11;
              pEVar9 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
              iVar5 = -2;
              local_898 = pEVar9;
              if (pEVar9 != (EC_T_CHAR *)0x0) {
                iVar4 = strcasecmp(pEVar9,"off");
                if (iVar4 == 0) {
                  local_878 = 0;
                  pcVar11 = local_888;
                  goto LAB_00146d87;
                }
                if (pEVar9 != (EC_T_CHAR *)0x0) {
                  iVar4 = strcasecmp(pEVar9,"busshift");
                  if (iVar4 == 0) {
                    local_878 = 1;
                    pcVar11 = local_888;
                    goto LAB_00146d87;
                  }
                  if (pEVar9 != (EC_T_CHAR *)0x0) {
                    iVar4 = strcasecmp(pEVar9,"mastershift");
                    if (iVar4 == 0) {
                      local_878 = 2;
                      pcVar11 = local_888;
                      goto LAB_00146d87;
                    }
                    if (pEVar9 != (EC_T_CHAR *)0x0) {
                      iVar4 = strcasecmp(pEVar9,"masterrefclock");
                      if (iVar4 == 0) {
                        local_878 = 4;
                        pcVar11 = local_888;
                        goto LAB_00146d87;
                      }
                      if (pEVar9 != (EC_T_CHAR *)0x0) {
                        iVar4 = strcasecmp(pEVar9,"dcx");
                        local_878 = 5;
                        pcVar11 = local_888;
                        if (iVar4 == 0) goto LAB_00146d87;
                      }
                    }
                  }
                }
              }
              goto LAB_001472e3;
            }
            iVar5 = strcasecmp(pEVar9,"-ctloff");
            if (iVar5 == 0) {
              local_850 = 1;
            }
            else {
              iVar5 = strcasecmp(pEVar9,"-key");
              if (iVar5 == 0) {
                local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
                pcVar11 = local_898;
                if (local_898 == (EC_T_CHAR *)0x0) {
                  iVar5 = -2;
                  goto LAB_001472e3;
                }
              }
              else {
                iVar5 = strcasecmp(pEVar9,"-c");
                if (iVar5 != 0) {
                  local_888 = pcVar11;
                  EVar3 = CreateLinkParmsFromCmdLine
                                    (&local_898,(EC_T_CHAR **)szCommandLine,&tcStorage,&bGetNextWord
                                     ,apLinkParms + local_8b0);
                  iVar10 = -2;
                  iVar5 = -2;
                  if (EVar3 != 0) goto LAB_001472e3;
                  if ((uint)local_8b0 < 2) {
                    apLinkParms[local_8b0]->dwIstPriority =
                         0x10000 << ((byte)local_870 & 0x1f) | 0x61;
                    local_8b0 = (ulong)((uint)local_8b0 + 1);
                    pcVar11 = local_888;
                    iVar10 = iVar4;
                    goto LAB_00146d87;
                  }
                  local_8b0._0_4_ = 2;
                  bVar13 = true;
                  pvTimingEvent = (void *)0x0;
                  goto LAB_001472f0;
                }
                GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
              }
            }
          }
        }
LAB_00146d87:
        if (bGetNextWord != 0) {
          local_898 = GetNextWord((EC_T_CHAR **)szCommandLine,&tcStorage);
        }
        bGetNextWord = 1;
        iVar4 = iVar10;
      } while (local_898 != (char *)0x0);
    }
    lVar2 = local_870;
    EVar3 = (EC_T_DWORD)local_870;
    local_888 = pcVar11;
    CAtEmLogging::InitLogging(&oLogging,0,10000,0x1d,EVar3,szLogFileprefix,0x4000);
    CAtEmLogging::SetLogThreadAffinity(&oLogging,EVar3);
    OsAddDbgMsgHook(CAtEmLogging::OsDbgMsgHookWrapper);
    CAtEmLogging::LogMsg(&oLogging,"Full command line: %s\n",szFullCommandLine);
    bVar13 = szENIFilename[0] == '\0';
    if (bVar13) {
      local_840 = (EC_T_PBYTE)0x0;
    }
    if ((uint)local_8b0 == 0) {
      OsDbgMsg("Syntax error: missing link layer command line parameter\n");
      iVar10 = -2;
      bVar13 = false;
      local_8b0._0_4_ = 0;
      pvTimingEvent = (void *)0x0;
    }
    else {
      iVar4 = OsSetThreadAffinity(0,1 << ((byte)lVar2 & 0x1f));
      if (iVar4 == 0) {
        OsDbgMsg("ERROR: Set Affinity Failed!\n");
      }
      pvTimingEvent = (void *)OsCreateEvent();
      ppcVar1 = local_890;
      if (pvTimingEvent == (void *)0x0) {
        bVar13 = false;
        OsDbgMsg("ERROR: insufficient memory to create timing event!\n");
      }
      else {
        iVar4 = OsAuxClkInit(local_870,1000000 / ((ulong)local_890 & 0xffffffff),pvTimingEvent);
        if (iVar4 == 0) {
          OsDbgMsg("Run demo now with cycle time %d usec\n",(ulong)ppcVar1 & 0xffffffff);
          OsDbgMsg("Using %s\n","AuxClock");
          poLinkParmsRed = apLinkParms[1];
          if ((uint)local_8b0 != 2) {
            poLinkParmsRed = (EC_T_LINK_PARMS *)0x0;
          }
          EVar3 = EtherCATStack(&oLogging,(uint)bVar13 * 3 + eCnfType_Filename,local_840,
                                (uint)!bVar13 << 8,(EC_T_DWORD)local_890,(EC_T_INT)local_858,
                                (EC_T_DWORD)local_868,apLinkParms[0],pvTimingEvent,
                                (EC_T_DWORD)local_870,(EC_T_BOOL)local_848,(EC_T_WORD)local_860,
                                poLinkParmsRed,&oOsParms,(EC_T_DCM_MODE)local_878,
                                (EC_T_BOOL)local_850,callbackFct,local_888);
          OsDbgMsg("---EtherCATStack finished");
          if (EVar3 == 0) {
            iVar10 = 0;
          }
          bVar12 = true;
          bVar13 = false;
        }
        else {
          bVar13 = false;
          OsDbgMsg("ERROR at auxiliary clock initialization!\n");
          bVar12 = true;
        }
      }
    }
  }
  else {
    local_8b0._0_4_ = 0;
    pvTimingEvent = (void *)0x0;
  }
LAB_001472f0:
  if (iVar10 == -2) {
    OsDbgMsg("Syntax:\n");
    OsDbgMsg(
            "EcMasterDemoDc [-f ENI-FileName] [-t time] [-b time] [-a affinity] [-v lvl] [-perf] [-log Prefix]"
            );
    OsDbgMsg(" [-auxclk period]");
    OsDbgMsg(" [-sp [port]]");
    ShowLinkLayerSyntax1();
    OsDbgMsg("   -f                Use given ENI file\n");
    OsDbgMsg("     FileName        file name .xml\n");
    OsDbgMsg("   -t                Demo duration\n");
    OsDbgMsg("     time            Time in msec, 0 = forever (default = 120000)\n");
    OsDbgMsg("   -b                Bus cycle time\n");
    OsDbgMsg("     cycle time      Cycle time in usec\n");
    OsDbgMsg("   -a                CPU affinity\n");
    OsDbgMsg("     affinity        0 = first CPU, 1 = second, ...\n");
    OsDbgMsg("   -v                Set verbosity level\n");
    OsDbgMsg(
            "     lvl             Level: 0=off, 1...n=more messages, 3(default) generate dcmlog file\n"
            );
    OsDbgMsg("   -perf             Enable job measurement\n");
    OsDbgMsg("   -log              Use given file name prefix for log files\n");
    OsDbgMsg("     Prefix          prefix\n");
    OsDbgMsg("   -auxclk           use auxiliary clock\n");
    OsDbgMsg("     period          clock period in usec\n");
    OsDbgMsg("   -sp               Server port binding\n");
    OsDbgMsg("     port            port (default = %d)\n",6000);
    OsDbgMsg("   -dcmmode          Set DCM mode\n");
    OsDbgMsg("     off             Off\n");
    OsDbgMsg("     busshift        BusShift mode (default)\n");
    OsDbgMsg("     mastershift     MasterShift mode\n");
    OsDbgMsg("     masterrefclock  MasterRefClock mode\n");
    OsDbgMsg("     dcx             External synchronization mode\n");
    OsDbgMsg("   -ctloff           Disable DCM control loop for diagnosis\n");
    ShowLinkLayerSyntax2();
  }
  OsDbgMsg("EcMasterDemoDc stop.\n");
  if (iVar10 != 0) {
    LinuxSleep(5000);
  }
  if (bVar12) {
    OsAuxClkDeinit();
  }
  if (pvTimingEvent != (void *)0x0) {
    OsDeleteEvent(pvTimingEvent);
  }
  if (!bVar13) {
    CAtEmLogging::DeinitLogging(&oLogging);
  }
  OsDeinit();
  if ((uint)local_8b0 != 0) {
    uVar8 = (ulong)(uint)local_8b0;
    do {
      if (apLinkParms[uVar8 - 1] != (EC_T_LINK_PARMS *)0x0) {
        free(apLinkParms[uVar8 - 1]);
        apLinkParms[uVar8 - 1] = (EC_T_LINK_PARMS *)0x0;
      }
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return iVar10;
}

Assistant:

int mainEtherCAT(int nArgc, char* ppArgv[])
#endif
{
// 	ethercat::callbackFctPtr = callbackFctPtr;
    int                     nRetVal             = APP_ERROR;
    EC_T_DWORD              dwRes               = EC_E_ERROR;
    EC_T_BOOL               bLogInitialized     = EC_FALSE;
    EC_T_CHAR               szCommandLine[COMMAND_LINE_BUFFER_LENGTH];
    EC_T_CHAR               szFullCommandLine[COMMAND_LINE_BUFFER_LENGTH];
    EC_T_BOOL               bGetNextWord        = EC_TRUE;
    EC_T_CHAR*              ptcWord             = EC_NULL;
    EC_T_CHAR               tcStorage           = '\0';

    EC_T_CHAR               szLogFileprefix[256] = {'\0'};
    EC_T_CNF_TYPE           eCnfType            = eCnfType_Unknown;
    EC_T_PBYTE              pbyCnfData          = 0;
    EC_T_DWORD              dwCnfDataLen        = 0;
    EC_T_CHAR               szENIFilename[256]  = {'\0'};
//     EC_T_DWORD              dwDuration          = 120000;
    EC_T_DWORD              dwDuration          = 0;	// 0 = no timeout
    EC_T_DWORD              dwNumLinkLayer     = 0;
    EC_T_LINK_PARMS*        apLinkParms[MAX_LINKLAYER];
#ifdef ATEMRAS_SERVER
    EC_T_WORD               wServerPort = 0xFFFF;
#endif
    CAtEmLogging            oLogging;
    EC_T_DWORD              dwCpuIndex          = 0;
    EC_T_CPUSET             CpuSet;
    EC_T_BOOL               bEnaPerfJobs        = EC_FALSE;  /* enable job measurements */
    EC_T_TIMING_DESC        TimingDesc;
#if !(defined XENOMAI)
    EC_T_BOOL               bStartTimingTask    = EC_FALSE;
#endif
    EC_T_INT                nVerbose            = 0;
#if (defined UNDER_CE) && (_WIN32_WCE >= 0x600)
    BOOL                    bRes                = FALSE;
    DWORD                   dwAuxClkSysIntr     = 0;
    DWORD                   dwWinRes            = EC_E_ERROR;
#endif
#if (defined UNDER_RTSS)
    HANDLE                  hTimer              = NULL;
    LARGE_INTEGER           liTimer;
#endif
#if (defined EC_VERSION_RTEMS)
    rtems_id                timerId;
    rtems_status_code       status;
#endif /* EC_VERSION_RTEMS */
    EC_T_OS_PARMS           oOsParms;
    EC_T_DCM_MODE           eDcmMode            = eDcmMode_BusShift;
    EC_T_BOOL               bCtlOff             = EC_FALSE;
	char* 					licenseKey			= "";

    OsMemset(apLinkParms, 0, sizeof(apLinkParms));
    OsMemset(&TimingDesc, 0, sizeof(TimingDesc));
    OsMemset(&oOsParms, 0, sizeof(EC_T_OS_PARMS));

    szCommandLine[0] = '\0';

    /* OS specific initialization */
    oOsParms.dwSize                         = sizeof(EC_T_OS_PARMS);
    oOsParms.dwSupportedFeatures            = 0xFFFFFFFF;
#if (defined WIN32) && !(defined UNDER_CE)
    SetConsoleCtrlHandler( (PHANDLER_ROUTINE)win32CtrlCHandler, TRUE );
#endif

#if (defined RTOS_32)
#ifdef ECWIN_RTOS32
    RTKernelInit(0);
    oOsParms.pfHwTimerGetInputFrequency     = Rtos32HwTimerGetInputFrequency;
    oOsParms.pfHwTimerModifyInitialCount    = Rtos32HwTimerModifyInitialCount;
#else
    RTKernelInit(4);
    RTCMOSSetSystemTime();

#ifdef RTOS_32_APIC
    if (!RTMPSetAPICMode(0))
    {
    static BYTE MPTableBuffer[1024]; // some space for the ACPI-generated table

        if (!RTMPACPITableCreate(MPTableBuffer, sizeof(MPTableBuffer), 0))
        {
            printf("RTMPACPITableCreate failed!\n");
        }
        if (!RTMPSetAPICMode(0))
        {
            printf("RTMPSetAPICMode failed!\n");
            nRetVal = APP_ERROR;
            goto Exit;
        }
    }
#endif /* RTOS_32_APIC */
    {
        UINT CPUClock         = RTSMBIOSGetCPUSpeed();
        UINT BusClockBIOS     = RTSMBIOSGetBusSpeed();
        UINT BusClockMeasured = RTMPBusFromCPUClock(CPUClock, 40000000);    /* 40M, that's 1/100 of a second on a 4GHz machine */

        OsDbgMsg("CPU Clock         : %uMHz\n""Bus Clock         : %uMHz\n""Bus Clock measured: %uMHz\n\n",
                    CPUClock,BusClockBIOS,BusClockMeasured);
    }

    /* workaround for IDE driver */
    RTMPSetIOAPICVector(0, 5, 5, 1, 1);

    /* prevent warning message "IDE driver in PIO mode */
    for (int nDevIndex = 0; nDevIndex < 8; nDevIndex++)
    {
        if (RTFDeviceList[nDevIndex].DeviceType == RTF_DEVICE_FDISK)
        {
            RTFDeviceList[nDevIndex].DeviceFlags |= RTF_DEVICE_NO_DIAG_MSG;
        }
        else if (RTFDeviceList[nDevIndex].DeviceType == 0)
        {
            break;
        }
    }
#endif
    RTKPreemptionsON();
#if (defined ATEMRAS_SERVER) && (defined EC_SOCKET_IP_SUPPORTED) && (defined INCLUDE_RTIP)
    NetInitialize();
#endif
#endif /* RTOS_32 */
#if (defined ECWIN_RTOS32)
    {
    void* pvReg = NULL;

        /* protect memory area at address 0 (detect NULL pointer access) */
        pvReg = NULL;
        RTReserveVirtualAddress(&pvReg, 0x1000, RT_MAP_NO_RELOCATE);

        /* start thread waiting for termination request */
        RTKRTLCreateThread( (RTKThreadFunction)tTerminationReq, 64, 0x1000, TF_NO_MATH_CONTEXT, NULL, "tTerminationReq" );

        printf( "you can stop the demo by typing CTRL-C or ESCAPE in the debug console\n");
    }
#endif /* ECWIN_RTOS32 */
#if (defined ECWIN)
    /* must be call before any RtosLib API call */
    RtosLibInit();
    
    /* must be call before any file open (RtosLibFile) call */
    RtosCommStart();
#endif /* ECWIN */

#if (defined VXWORKS)
    /* change VxWorks standard task priorities to optimize EtherCAT performance */
#ifndef VXWORKS_NORMAL_PRIO
    vxTaskPrioChange( "tJobTask" );
    vxTaskPrioChange( "tLogTask" );
    vxTaskPrioChange( "tNbioLog" );
    vxTaskPrioChange( "tShell" );
    vxTaskPrioChange( "tShell0" );
    vxTaskPrioChange( "tShellRem1" );
    vxTaskPrioChange( "tShellRem2" );
    vxTaskPrioChange( "tWdbTask" );
    vxTaskPrioChange( "tTelnetd" );
#endif
#if ((defined _WRS_VXWORKS_MAJOR) && (defined _WRS_VXWORKS_MINOR) && ( (_WRS_VXWORKS_MAJOR >= 7) || ((_WRS_VXWORKS_MAJOR == 6) && (_WRS_VXWORKS_MINOR >= 5)) ))
    taskPrioritySet( taskNameToId("tNet0"), RECV_THREAD_PRIO );
#else
    taskPrioritySet( taskNameToId("tNetTask"), RECV_THREAD_PRIO );
#endif
    /* redirect outputs to target shell console device */
#if (_WRS_VXWORKS_MAJOR < 7) || ! defined(_WRS_VXWORKS_MAJOR)
    int nTidTargetShell = taskNameToId("tShellRem1");
    if (-1 != nTidTargetShell)
#else
    TASK_ID nTidTargetShell = taskNameToId("tShellRem1");
    if (ERROR != taskIdVerify(nTidTargetShell))
#endif
    {
        /* redirect all outputs at the target shell */
        ioGlobalStdSet (STD_OUT, ioTaskStdGet(nTidTargetShell,STD_OUT));
        ioGlobalStdSet (STD_ERR, ioTaskStdGet(nTidTargetShell,STD_ERR));
    }
    /* sysclk always set to 1msec */
    sysClkRateSet(1000);
#endif /* VXWORKS */

#if (defined LINUX) && !(defined RTAI)
	
	
	
	
    dwRes = EnableRealtimeEnvironment();
    if (EC_E_NOERROR != dwRes)
    {
        goto Exit;
    }
    {
        sigset_t SigSet;
        int nSigNum = SIGALRM;
        sigemptyset(&SigSet);
        sigaddset(&SigSet, nSigNum);
        sigprocmask(SIG_BLOCK, &SigSet, NULL);
//         signal(SIGINT, SignalHandler);
//         signal(SIGTERM, SignalHandler);
    }
#endif /* LINUX && !RTAI */

#if (defined __INTEGRITY)
    WaitForFileSystemInitialization();
#endif

#if (defined __RCX__)
    ATEMDEMO_STARTUPPARAMETER_T* pStartup = ((ATEMDEMO_STARTUPPARAMETER_T*)pvInit);

    TCHAR* lpCmdLine = (TCHAR*)(pStartup->szParamList);
    lpCmdLine = (lpCmdLine==EC_NULL)?(TCHAR*)" ":lpCmdLine;
    tcStorage = *lpCmdLine;
#endif

#if (defined EC_VERSION_GO32)
    if (!io_Init())
    {
        OsDbgMsg("Fail to initialize Vortex86 I/O library\n");
        nRetVal = APP_ERROR;
        goto Exit;
    }
    if (!irq_Init())
    {
        OsDbgMsg("Fail to initialize Vortex86 IRQ library\n");
        io_Close();     /* Deinit IOs */
        nRetVal = APP_ERROR;
        goto Exit;
    }
#endif

#if !(defined UNDER_RTSS) && !(defined RTAI)
    /* Seed the random-number generator with current time so that
     * the numbers will be different every time we run.
     */
    srand((unsigned)OsQueryMsecCount());
#endif
    /* set running flag */
    bRun = EC_TRUE;

    /* add hook to log all EtherCAT messages. Without hook no messages will be generated! */
    OsAddDbgMsgHook(CAtEmLogging::OsDbgMsgHookWrapper);

    /* Initialize Timing Event descriptor */
    TimingDesc.bShutdown          = EC_FALSE;
    TimingDesc.bIsRunning         = EC_FALSE;
#if (defined RTAI)
    TimingDesc.dwBusCycleTimeUsec = G_dwBusCycleTimeUsec;
#else
	std::cout << "ECMASTERLIB: CYCLE_TIME: " << CYCLE_TIME << std::endl;
// 	std::cout << "ECMASTERLIB: G_dwBusCycleTimeUsec: " << G_dwBusCycleTimeUsec << std::endl;
    TimingDesc.dwBusCycleTimeUsec = CYCLE_TIME * 1000;
#endif

    /* prepare command line */
#if (defined VXWORKS)
    OsStrncpy(szCommandLine, lpCmdLine, sizeof(szCommandLine) - 1);
#elif (defined RTOS_32)
#if (defined ECWIN_RTOS32)
    {
    VMF_HANDLE hEcatKey;
    VMF_CONFIG_ADDDATA AddData;
    UINT32 dwLength = 0;

        dwRes = vmfConfigRegKeyOpenA(VMF_CONFIGREG_HKEY_OS_CURRENT, "Ecat", &hEcatKey);
        if( dwRes == RTE_SUCCESS )
        {

            dwLength = sizeof(szCommandLine);
            vmfConfigRegValueQueryA(hEcatKey, "CommandLine", NULL, NULL, (UINT8*)&szCommandLine[0], &dwLength );
            vmfConfigRegKeyClose(hEcatKey);
        }
        if ('\0' == szCommandLine[0])
        {
            /* for compatibility */
            dwLength = sizeof(szCommandLine);
            dwRes = vmfConfigQueryValue( "Ecat", "CommandLine", VMF_CONFIG_SZ_TYPE, (UINT8*)&szCommandLine[0], &dwLength, &AddData);
            if( dwRes != RTE_SUCCESS )
            {
                printf( "Cannot read EtherCAT demo command line, (EcatShm.config)\n" );
                printf( "Please, enter command line (e.g. atemDemo -v 2 -i8255x 1 1):\n" );
            }
        }
    }
#else
    OsStrncpy(szCommandLine, GetCommandLine(), sizeof(szCommandLine) - 1);
#endif /* !ECWIN_RTOS32 */
#elif (defined RTAI)
    OsStrncpy(szCommandLine, "-i8254x 1 1 -v 1 -t 15000 ", sizeof(szCommandLine) - 1);
#elif (defined __TKERNEL) && (defined __arm__)
    /*-fixed command line for T-Kernel on ARM */
    OsStrncpy(szCommandLine, "-l9218i 1 -v 1 -t 0 -f eni.xml", sizeof(szCommandLine) - 1);
#elif (defined EC_VERSION_SYSBIOS) || (defined EC_VERSION_RIN32M3) || (defined EC_VERSION_XILINX_STANDALONE) ||\
    (defined EC_VERSION_ETKERNEL) || (defined EC_VERSION_RZT1) || (defined EC_VERSION_RZGNOOS) || (defined EC_VERSION_JSLWARE)
    OsStrncpy(szCommandLine, DEMO_PARAMETERS, sizeof(szCommandLine) - 1);
#elif (defined EC_VERSION_RTEMS)
    /* copy cmdline without the applications name(first token) */
    OsStrncpy(szCommandLine, strchr(bsp_boot_cmdline,' '),sizeof(szCommandLine) - 1);
#else
    /* build szCommandLine from argument list */
    {
    EC_T_CHAR* pcStrCur   = szCommandLine;
    EC_T_INT   nStrRemain = COMMAND_LINE_BUFFER_LENGTH;
#if (defined UNDER_CE)
    EC_T_CHAR  szStrFormat[] = "%S"; /* convert UNICODE to multibyte */
#else
    EC_T_CHAR  szStrFormat[] = "%s";
#endif
        /* build szCommandLine from argument list, skipping executable name */
        for (nArgc--, ppArgv++; nArgc > 0; nArgc--, ppArgv++)
        {
        EC_T_BOOL bIsFileName = EC_FALSE;

            /* insert next argument */
            OsSnprintf(pcStrCur, nStrRemain - 1, szStrFormat, *ppArgv);

            /* check for file name */
            if (0 == OsStrcmp(pcStrCur, "-f"))
            {
                bIsFileName = EC_TRUE;
            }
            /* adjust string cursor */
            nStrRemain -= (EC_T_INT)OsStrlen(pcStrCur);
            pcStrCur = pcStrCur + OsStrlen(pcStrCur);

            /* insert space */
            OsStrncpy(pcStrCur, " ", nStrRemain - 1); nStrRemain--; pcStrCur++;

            if (bIsFileName && (1 < nArgc))
            {
                /* move to next arg (ENI file name) */
                nArgc--; ppArgv++;

                /* insert quotation mark */
                OsStrncpy(pcStrCur, "\"", nStrRemain - 1); nStrRemain--; pcStrCur++;

                /* insert ENI file name */
                OsSnprintf(pcStrCur, nStrRemain - 1, szStrFormat, *ppArgv); nStrRemain -= (EC_T_INT)OsStrlen(pcStrCur);
                pcStrCur = pcStrCur + OsStrlen(pcStrCur);

                /* insert quotation mark */
                OsStrncpy(pcStrCur, "\" ", nStrRemain - 1); nStrRemain--; pcStrCur++;
            }
        }
    }
#endif
    /* backup full command line */
    OsStrncpy(szFullCommandLine, szCommandLine, sizeof(szFullCommandLine) - 1);

    /* parse command line */
    for (ptcWord = OsStrtok(szCommandLine, " "); ptcWord != EC_NULL;)
    {
        if( 0 == OsStricmp( ptcWord, "-f") )
        {
            EC_T_INT nPtcWordIndex = 3;

            /* Search for the start of the config file name. The config file
               name may start with quotation marks because of blanks in the filename */
            while(ptcWord[nPtcWordIndex] != '\0')
            {
                if(ptcWord[nPtcWordIndex] == '\"' || ptcWord[nPtcWordIndex] != ' ')
                {
                    break;
                }
                nPtcWordIndex++;
            }

            /* Depending of a config file name within quotation marks (or without
               quotation marks) extract the filename */
            if(ptcWord[nPtcWordIndex] == '\"')
            {
                /* Check if the strtok position is already correct */
                if(nPtcWordIndex > 3)
                {
                    /* More than 1 blank before -f. Correct strtok position. */
                    OsStrtok(EC_NULL,"\"");
                }

                /* Now extract the config file name */
                ptcWord = OsStrtok(EC_NULL,"\"");
            }
            else
            {
                /* Extract the config file name if it was not set within quotation marks */
                ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
            }

            if (
                (ptcWord == EC_NULL)
             || (OsStrncmp( ptcWord, "-", 1) == 0)
               )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            OsSnprintf(szENIFilename, sizeof(szENIFilename) - 1, "%s", ptcWord);
        }
        else if( 0 == OsStricmp( ptcWord, "-log") )
        {
            EC_T_INT nPtcWordIndex = 4;

            /* Search for the start of the config file name. The config file
               name may start with quotation marks because of blanks in the filename */
            while(ptcWord[nPtcWordIndex] != '\0')
            {
                if(ptcWord[nPtcWordIndex] == '\"' || ptcWord[nPtcWordIndex] != ' ')
                {
                    break;
                }
                nPtcWordIndex++;
            }

            /* Depending of a config file name within quotation marks (or without
               quotation marks) extract the filename */
            if(ptcWord[nPtcWordIndex] == '\"')
            {
                /* Check if the strtok position is already correct */
                if(nPtcWordIndex > 3)
                {
                    /* More than 1 blank before -f. Correct strtok position. */
                    OsStrtok(EC_NULL,"\"");
                }

                /* Now extract the config file name */
                ptcWord = OsStrtok(EC_NULL,"\"");
            }
            else
            {
                /* Extract the config file name if it was not set within quotation marks */
                ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
            }

            if (
                (ptcWord == EC_NULL)
             || (OsStrncmp( ptcWord, "-", 1) == 0)
               )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            OsSnprintf(szLogFileprefix, sizeof(szLogFileprefix) - 1, "%s", ptcWord);
        }
        else if (OsStricmp( ptcWord, "-t") == 0)
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
            if (
                (ptcWord == EC_NULL)
             || (OsStrncmp( ptcWord, "-", 1) == 0)
               )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            dwDuration = OsStrtol(ptcWord, EC_NULL, 0);
        }
        else if( OsStricmp( ptcWord, "-auxclk") == 0)
        {
#if (defined AUXCLOCK_SUPPORTED)
            TimingDesc.bUseAuxClock = EC_TRUE;
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if (
                (ptcWord == EC_NULL)
                || (OsStrncmp( ptcWord, "-", 1) == 0)
                )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            TimingDesc.dwBusCycleTimeUsec = OsStrtol(ptcWord, EC_NULL, 0);
            if( TimingDesc.dwBusCycleTimeUsec < 10 )
            {
                TimingDesc.dwBusCycleTimeUsec = 10;
            }
#else
            OsDbgMsg( "Auxiliary clock not supported by this operating system!)\n" );
            goto Exit;
#endif
        }
        else if (OsStricmp( ptcWord, "-b") == 0)
        {
#if (defined AUXCLOCK_SUPPORTED)
            if( EC_TRUE == TimingDesc.bUseAuxClock )
            {
                OsDbgMsg( "Using bus cycle time %d usec from auxclock parameter\n", TimingDesc.dwBusCycleTimeUsec );
            }
            else
#endif
            {
                ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage );
                if (
                    (ptcWord == EC_NULL)
                 || (OsStrncmp( ptcWord, "-", 1) == 0)
                   )
                {
                    nRetVal = SYNTAX_ERROR;
                    goto Exit;
                }
                TimingDesc.dwBusCycleTimeUsec = OsStrtol(ptcWord, EC_NULL, 0);
            }
        }
        else if (OsStricmp( ptcWord, "-a") == 0)
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if (
                (ptcWord == EC_NULL)
                || (OsStrncmp( ptcWord, "-", 1) == 0)
                )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            dwCpuIndex = OsStrtol(ptcWord, EC_NULL, 0);
        }
        else if (OsStricmp( ptcWord, "-v") == 0)
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if (
                (ptcWord == EC_NULL)
                || (OsStrncmp( ptcWord, "-", 1) == 0)
                )
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
            nVerbose = OsStrtol(ptcWord, EC_NULL, 10);
        }
        else if (OsStricmp( ptcWord, "-perf") == 0)
        {
            bEnaPerfJobs = EC_TRUE;
        }
#if (defined ATEMRAS_SERVER)
        else if( OsStricmp(ptcWord, "-sp") == 0 )
        {
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
            if ((ptcWord == NULL) || (OsStrncmp(ptcWord, "-", 1) == 0))
            {
                wServerPort  = ATEMRAS_DEFAULT_PORT;

                /* optional sub parameter not found, use the current word for the next parameter */
                bGetNextWord = EC_FALSE;
            }
            else
            {
                wServerPort = (EC_T_WORD)OsStrtol(ptcWord, EC_NULL, 10);
            }
        }
#endif
        else if (OsStricmp(ptcWord, "-dcmmode") == 0)
        {
            /* Extract the config file name if it was not set within quotation marks */
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);

            if      ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "off") == 0))           eDcmMode = eDcmMode_Off;
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "busshift") == 0))       eDcmMode = eDcmMode_BusShift;
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "mastershift") == 0))    eDcmMode = eDcmMode_MasterShift;
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "masterrefclock") == 0)) eDcmMode = eDcmMode_MasterRefClock;
#if (defined INCLUDE_DCX)
            else if ((EC_NULL != ptcWord) && (OsStricmp(ptcWord, "dcx") == 0))            eDcmMode = eDcmMode_Dcx;
#endif
            else
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
        }
        else if (OsStricmp( ptcWord, "-ctloff") == 0)
        {
            bCtlOff = EC_TRUE;
        }
        else if (OsStricmp(ptcWord, "-key") == 0)
        {
            /* Extract the config file name if it was not set within quotation marks */
            ptcWord = GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);

            if      (EC_NULL != ptcWord)           licenseKey = ptcWord;
            else
            {
                nRetVal = SYNTAX_ERROR;
                goto Exit;
            }
        }
        else if (OsStricmp(ptcWord, "-c") == 0)
        {
            /* Ignored in ecmasterlib 
			 * Used for EEROS HAL */
			GetNextWord((EC_T_CHAR**)&szCommandLine, &tcStorage);
        }
        else
        {
           dwRes = CreateLinkParmsFromCmdLine(&ptcWord, (EC_T_CHAR**)&szCommandLine, &tcStorage, &bGetNextWord, &apLinkParms[dwNumLinkLayer]);
           if (EC_E_NOERROR != dwRes)
           {
               nRetVal = SYNTAX_ERROR;
               goto Exit;
           }
           if (dwNumLinkLayer > 1)
           {
               nRetVal = SYNTAX_ERROR;
               goto Exit;
           }
           else
           {
#ifdef LINUX
               EC_CPUSET_ZERO(CpuSet);
               EC_CPUSET_SET(CpuSet, dwCpuIndex);
               apLinkParms[dwNumLinkLayer]->dwIstPriority = (CpuSet << 16) | RECV_THREAD_PRIO;
#else
               apLinkParms[dwNumLinkLayer]->dwIstPriority = RECV_THREAD_PRIO;
#endif
               dwNumLinkLayer++;
           }
        }